

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
                  *this,vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                        *container,MatchResultListener *listener)

{
  undefined1 *this_00;
  bool bVar1;
  Flags FVar2;
  const_reference this_01;
  size_t sVar3;
  size_t sVar4;
  MatchResultListener *this_02;
  bool local_f2;
  UnorderedElementsAreMatcherImplBase local_98;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
  local_78;
  undefined1 local_70 [8];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  *container_local;
  UnorderedElementsAreMatcherImpl<const_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_&>
  *this_local;
  
  this_01 = StlContainerView<std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
            ::ConstReference(container);
  this_00 = &matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  local_78._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
        *)std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
          ::begin(this_01);
  local_98.matcher_describers_.
  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                ::end(this_01);
  UnorderedElementsAreMatcherImpl<std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>const&>
  ::
  AnalyzeElements<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,pstore::extent<char>>const*,std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>>>
            ((MatchMatrix *)local_70,
             (UnorderedElementsAreMatcherImpl<std::vector<std::pair<std::__cxx11::string_const,pstore::extent<char>>,std::allocator<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>const&>
              *)this,local_78,
             (__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>_>
              )local_98.matcher_describers_.
               super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,listener);
  sVar3 = MatchMatrix::LhsSize((MatchMatrix *)local_70);
  if ((sVar3 == 0) && (sVar3 = MatchMatrix::RhsSize((MatchMatrix *)local_70), sVar3 == 0)) {
    this_local._7_1_ = true;
  }
  else {
    FVar2 = UnorderedElementsAreMatcherImplBase::match_flags
                      (&this->super_UnorderedElementsAreMatcherImplBase);
    if (FVar2 == ExactMatch) {
      sVar3 = MatchMatrix::LhsSize((MatchMatrix *)local_70);
      sVar4 = MatchMatrix::RhsSize((MatchMatrix *)local_70);
      if (sVar3 != sVar4) {
        sVar3 = MatchMatrix::LhsSize((MatchMatrix *)local_70);
        if ((sVar3 != 0) && (bVar1 = MatchResultListener::IsInterested(listener), bVar1)) {
          this_02 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
          sVar3 = MatchMatrix::LhsSize((MatchMatrix *)local_70);
          UnorderedElementsAreMatcherImplBase::Elements(&local_98,sVar3);
          MatchResultListener::operator<<(this_02,(Message *)&local_98);
          Message::~Message((Message *)&local_98);
        }
        this_local._7_1_ = false;
        goto LAB_001afaad;
      }
    }
    bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                      (&this->super_UnorderedElementsAreMatcherImplBase,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10,(MatchMatrix *)local_70,listener);
    local_f2 = false;
    if (bVar1) {
      local_f2 = UnorderedElementsAreMatcherImplBase::FindPairing
                           (&this->super_UnorderedElementsAreMatcherImplBase,(MatchMatrix *)local_70
                            ,listener);
    }
    this_local._7_1_ = local_f2;
  }
LAB_001afaad:
  local_98.matcher_describers_.
  super__Vector_base<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  MatchMatrix::~MatchMatrix((MatchMatrix *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
      return true;
    }

    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      if (matrix.LhsSize() != matrix.RhsSize()) {
        // The element count doesn't match.  If the container is empty,
        // there's no need to explain anything as Google Mock already
        // prints the empty container. Otherwise we just need to show
        // how many elements there actually are.
        if (matrix.LhsSize() != 0 && listener->IsInterested()) {
          *listener << "which has " << Elements(matrix.LhsSize());
        }
        return false;
      }
    }

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }